

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse41_128_16.c
# Opt level: O3

parasail_result_t *
parasail_sg_flags_rowcol_diag_sse41_128_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  ushort uVar1;
  int *piVar2;
  int *piVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  short sVar7;
  short sVar8;
  bool bVar9;
  short sVar10;
  bool bVar11;
  short sVar12;
  bool bVar13;
  short sVar14;
  unkbyte10 Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  short sVar19;
  int iVar20;
  uint uVar21;
  parasail_result_t *ppVar22;
  int16_t *ptr;
  int16_t *ptr_00;
  int16_t *ptr_01;
  int16_t *ptr_02;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  undefined8 unaff_RBX;
  short sVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  int16_t iVar43;
  uint uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  undefined4 uVar52;
  undefined1 auVar54 [16];
  undefined4 uVar53;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  ushort uVar73;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  ushort uVar81;
  ushort uVar82;
  undefined1 auVar74 [16];
  ushort uVar83;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar91 [16];
  undefined1 in_XMM15 [16];
  ulong local_220;
  short local_1e8;
  short sStack_1e6;
  undefined1 local_1d8 [16];
  short local_1c8;
  short sStack_1c6;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  int *local_168;
  ulong local_160;
  ulong local_158;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  ulong local_128;
  ulong local_120;
  int *local_118;
  int *local_110;
  int *local_108;
  int *local_100;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  short sVar51;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar84;
  short sVar86;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_7();
    return (parasail_result_t *)0x0;
  }
  uVar46 = (ulong)(uint)s2Len;
  if (s2Len < 1) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_rowcol_diag_sse41_128_16_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_rowcol_diag_sse41_128_16_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_rowcol_diag_sse41_128_16_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar20 = _s1Len + 7;
  uVar48 = s2Len + 7;
  iVar39 = -open;
  iVar26 = matrix->min;
  iVar30 = -iVar26;
  if (iVar26 != iVar39 && SBORROW4(iVar26,iVar39) == iVar26 + open < 0) {
    iVar30 = open;
  }
  uVar36 = iVar30 - 0x7fff;
  iVar26 = matrix->max;
  auVar54 = pshuflw(ZEXT416(uVar36),ZEXT416(uVar36),0);
  uVar52 = auVar54._0_4_;
  local_1e8 = auVar54._0_2_;
  sStack_1e6 = auVar54._2_2_;
  local_d8 = 0;
  local_1d8 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    auVar54 = pshuflw(ZEXT416((uint)(gap * 8)),ZEXT416((uint)(gap * 8)),0);
    local_d8 = auVar54._0_4_;
  }
  local_178._0_8_ = CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar52));
  local_178._8_8_ = CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar52));
  local_188._8_8_ = local_178._8_8_;
  local_188._0_8_ = local_178._0_8_;
  local_b8._8_8_ = local_178._8_8_;
  local_b8._0_8_ = local_178._0_8_;
  local_198._8_8_ = local_178._8_8_;
  local_198._0_8_ = local_178._0_8_;
  local_c8._8_8_ = local_178._8_8_;
  local_c8._0_8_ = local_178._0_8_;
  uVar1 = (ushort)iVar39;
  sVar19 = (short)gap;
  if (s1_beg == 0) {
    local_1d8._8_8_ =
         (ulong)(uint)(gap * 0xfffd - open) & 0xffff | (ulong)(ushort)(uVar1 + sVar19 * -2) << 0x10
         | (ulong)(ushort)(uVar1 - sVar19) << 0x20 | (ulong)uVar1 << 0x30;
    local_1d8._0_8_ =
         (ulong)(uint)(gap * 0xfff9 - open) & 0xffffffff0000ffff |
         (ulong)(ushort)(sVar19 * -6 - (short)open) << 0x10 |
         (ulong)(ushort)(sVar19 * -5 - (short)open) << 0x20 |
         (ulong)(ushort)(uVar1 + sVar19 * -4) << 0x30;
  }
  uStack_d4 = local_d8;
  uStack_d0 = local_d8;
  uStack_cc = local_d8;
  ppVar22 = parasail_result_new_rowcol1(_s1Len,s2Len);
  if (ppVar22 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  ppVar22->flag =
       (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
       (uint)(s2_end != 0) << 0xf | ppVar22->flag | 0x8241002;
  uVar28 = (ulong)(s2Len + 0xe);
  ptr = parasail_memalign_int16_t(0x10,uVar28);
  ptr_00 = parasail_memalign_int16_t(0x10,uVar28);
  ptr_01 = parasail_memalign_int16_t(0x10,uVar28);
  if (ptr_01 == (int16_t *)0x0 || (ptr_00 == (int16_t *)0x0 || ptr == (int16_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int16_t(0x10,(long)iVar20);
    if (ptr_02 == (int16_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar2 = matrix->mapper;
      uVar28 = 0;
      do {
        ptr_02[uVar28] = (int16_t)piVar2[(byte)_s1[uVar28]];
        uVar28 = uVar28 + 1;
      } while ((uint)_s1Len != uVar28);
    }
    iVar30 = _s1Len + 1U;
    if ((int)(_s1Len + 1U) < iVar20) {
      iVar30 = iVar20;
    }
    memset(ptr_02 + _s1Len,0,(ulong)(uint)(~_s1Len + iVar30) * 2 + 2);
  }
  else {
    ptr_02 = (int16_t *)0x0;
  }
  auVar54 = ZEXT416((uint)CONCAT62((int6)((ulong)unaff_RBX >> 0x10),0x7ffe - (short)iVar26));
  auVar54 = pshuflw(auVar54,auVar54,0);
  auVar66 = pshuflw(ZEXT416((uint)_s1Len),ZEXT416((uint)_s1Len),0);
  auVar71 = pshuflw(ZEXT416((uint)s2Len),ZEXT416((uint)s2Len),0);
  uVar53 = auVar54._0_4_;
  auVar67._0_8_ = CONCAT44(uVar53,uVar53);
  auVar67._8_4_ = uVar53;
  auVar67._12_4_ = uVar53;
  auVar55 = pshuflw(auVar67,ZEXT416((uint)open),0);
  auVar74 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)gap),0);
  local_48._0_4_ = auVar66._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar66._8_4_ = 0xffffffff;
  auVar66._0_8_ = 0xffffffffffffffff;
  auVar66._12_4_ = 0xffffffff;
  local_68._0_4_ = auVar71._0_4_;
  local_68._4_4_ = local_68._0_4_;
  local_68._8_4_ = local_68._0_4_;
  local_68._12_4_ = local_68._0_4_;
  local_78 = auVar55._0_4_;
  local_88 = auVar74._0_4_;
  local_98 = paddsw(local_48,auVar66);
  local_58 = paddsw(auVar66,local_68);
  piVar2 = matrix->mapper;
  uVar28 = 0;
  do {
    ptr[uVar28 + 7] = (int16_t)piVar2[(byte)_s2[uVar28]];
    uVar28 = uVar28 + 1;
  } while (uVar46 != uVar28);
  ptr[3] = 0;
  ptr[4] = 0;
  ptr[5] = 0;
  ptr[6] = 0;
  ptr[0] = 0;
  ptr[1] = 0;
  ptr[2] = 0;
  ptr[3] = 0;
  uVar27 = s2Len + 1U;
  if ((int)(s2Len + 1U) < (int)uVar48) {
    uVar27 = uVar48;
  }
  uStack_84 = local_88;
  uStack_80 = local_88;
  uStack_7c = local_88;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  memset(ptr + uVar46 + 7,0,(ulong)(~s2Len + uVar27) * 2 + 2);
  uVar28 = 0;
  iVar43 = (int16_t)uVar36;
  iVar26 = iVar39;
  if (s2_beg == 0) {
    do {
      ptr_00[uVar28 + 7] = (int16_t)iVar26;
      ptr_01[uVar28 + 7] = iVar43;
      uVar28 = uVar28 + 1;
      iVar26 = iVar26 - gap;
    } while (uVar46 != uVar28);
  }
  else {
    do {
      ptr_00[uVar28 + 7] = 0;
      ptr_01[uVar28 + 7] = iVar43;
      uVar28 = uVar28 + 1;
    } while (uVar46 != uVar28);
  }
  lVar23 = 0;
  do {
    ptr_00[lVar23] = iVar43;
    ptr_01[lVar23] = iVar43;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 7);
  lVar23 = uVar46 + 7;
  uVar28 = uVar46;
  do {
    ptr_00[lVar23] = iVar43;
    ptr_01[lVar23] = iVar43;
    lVar23 = lVar23 + 1;
    uVar27 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar27;
  } while ((int)uVar27 < (int)uVar48);
  ptr_00[6] = 0;
  local_1c8 = auVar54._0_2_;
  sStack_1c6 = auVar54._2_2_;
  if (_s1Len < 1) {
    local_1a8._4_2_ = local_1e8;
    local_1a8._0_4_ = uVar52;
    local_1a8._6_2_ = sStack_1e6;
    local_1a8._8_2_ = local_1e8;
    local_1a8._10_2_ = sStack_1e6;
    local_1a8._12_2_ = local_1e8;
    local_1a8._14_2_ = sStack_1e6;
    local_c8 = local_1a8;
    local_198 = local_1a8;
    local_b8 = local_1a8;
    local_1b8._0_2_ = local_1c8;
    local_1b8._2_2_ = sStack_1c6;
    local_1b8._4_2_ = local_1c8;
    local_1b8._6_2_ = sStack_1c6;
    uStack_1b0._0_2_ = local_1c8;
    uStack_1b0._2_2_ = sStack_1c6;
    uStack_1b0._4_2_ = local_1c8;
    uStack_1b0._6_2_ = sStack_1c6;
  }
  else {
    local_168 = matrix->matrix;
    uVar27 = _s1Len - 1;
    uVar28 = (ulong)uVar27;
    Var15 = CONCAT28(local_1e8,CONCAT26(sStack_1e6,CONCAT24(local_1e8,uVar52)));
    auVar54._10_2_ = sStack_1e6;
    auVar54._0_10_ = Var15;
    auVar54._12_2_ = local_1e8;
    auVar54._14_2_ = sStack_1e6;
    local_a8 = auVar54 >> 0x10;
    auVar55 = local_a8;
    local_120 = (ulong)(s2Len - 1);
    local_128 = 1;
    if (1 < (int)uVar48) {
      local_128 = (ulong)uVar48;
    }
    uVar35 = (ulong)(uint)_s1Len;
    local_130 = uVar46 + 1;
    local_138 = uVar46 + 2;
    local_140 = uVar46 + 3;
    local_148 = uVar46 + 4;
    local_150 = uVar46 + 5;
    local_158 = uVar46 + 6;
    auVar66 = pmovsxbw(in_XMM12,0x1020304050607);
    local_220 = 0;
    uStack_1c0 = auVar67._8_8_;
    uStack_1b0 = uStack_1c0;
    local_c8 = auVar54;
    local_198 = auVar54;
    local_b8 = auVar54;
    local_1b8 = auVar67._0_8_;
    local_1a8 = auVar54;
    do {
      uVar48 = (uint)local_220;
      if (matrix->type == 0) {
        uVar21 = (uint)ptr_02[local_220 + 1];
        uVar50 = (uint)ptr_02[local_220 + 2];
        uVar37 = (uint)ptr_02[local_220 + 3];
        uVar33 = (uint)ptr_02[local_220 + 4];
        uVar44 = (uint)ptr_02[local_220 + 5];
        uVar40 = (uint)ptr_02[local_220 + 6];
        uVar49 = (int)ptr_02[local_220];
        uVar29 = (int)ptr_02[local_220 + 7];
      }
      else {
        uVar21 = uVar48 | 1;
        if (uVar35 <= (local_220 | 1)) {
          uVar21 = uVar27;
        }
        uVar50 = uVar48 | 2;
        if (uVar35 <= (local_220 | 2)) {
          uVar50 = uVar27;
        }
        uVar37 = uVar48 | 3;
        if (uVar35 <= (local_220 | 3)) {
          uVar37 = uVar27;
        }
        uVar33 = uVar48 | 4;
        if (uVar35 <= (local_220 | 4)) {
          uVar33 = uVar27;
        }
        uVar44 = uVar48 | 5;
        if (uVar35 <= (local_220 | 5)) {
          uVar44 = uVar27;
        }
        uVar40 = uVar48 | 6;
        if (uVar35 <= (local_220 | 6)) {
          uVar40 = uVar27;
        }
        uVar49 = uVar48;
        uVar29 = uVar48 | 7;
        if (uVar35 <= (local_220 | 7)) {
          uVar29 = uVar27;
        }
      }
      iVar26 = matrix->size;
      local_160 = local_220 + 8;
      local_e0 = local_168 + (int)(uVar44 * iVar26);
      local_e8 = local_168 + (int)(uVar37 * iVar26);
      local_f0 = local_168 + (int)(uVar21 * iVar26);
      local_f8 = local_168 + (int)(uVar49 * iVar26);
      local_100 = local_168 + (int)(uVar50 * iVar26);
      local_108 = local_168 + (int)(uVar33 * iVar26);
      local_110 = local_168 + (int)(uVar40 * iVar26);
      local_118 = local_168 + (int)(uVar29 * iVar26);
      local_a8._0_8_ = (undefined8)((unkuint10)Var15 >> 0x10);
      local_a8._8_8_ = auVar54._8_8_ >> 0x10;
      auVar71._8_8_ = local_a8._8_8_ | (ulong)(ushort)ptr_00[6] << 0x30;
      auVar71._0_8_ = local_a8._0_8_;
      uVar48 = iVar39 - uVar48 * gap;
      if (s1_beg != 0) {
        uVar48 = 0;
      }
      ptr_00[6] = uVar1 - (short)local_160 * sVar19;
      auVar90._8_8_ = local_a8._8_8_ | (ulong)uVar48 << 0x30;
      auVar90._0_8_ = local_a8._0_8_;
      uVar24 = local_220 | 1;
      uVar25 = local_220 | 2;
      uVar47 = local_220 | 3;
      uVar31 = local_220 | 4;
      uVar34 = local_220 | 5;
      uVar38 = local_220 | 6;
      uVar42 = local_220 | 7;
      auVar91._0_2_ = -(ushort)(local_98._0_2_ == auVar66._0_2_);
      auVar91._2_2_ = -(ushort)(local_98._2_2_ == auVar66._2_2_);
      auVar91._4_2_ = -(ushort)(local_98._4_2_ == auVar66._4_2_);
      auVar91._6_2_ = -(ushort)(local_98._6_2_ == auVar66._6_2_);
      auVar91._8_2_ = -(ushort)(local_98._8_2_ == auVar66._8_2_);
      auVar91._10_2_ = -(ushort)(local_98._10_2_ == auVar66._10_2_);
      auVar91._12_2_ = -(ushort)(local_98._12_2_ == auVar66._12_2_);
      auVar91._14_2_ = -(ushort)(local_98._14_2_ == auVar66._14_2_);
      in_XMM15 = pmovsxbw(in_XMM15,0xfffefdfcfbfaf9);
      auVar74._4_2_ = local_1e8;
      auVar74._0_4_ = uVar52;
      auVar74._6_2_ = sStack_1e6;
      auVar74._8_2_ = local_1e8;
      auVar74._10_2_ = sStack_1e6;
      auVar74._12_2_ = local_1e8;
      auVar74._14_2_ = sStack_1e6;
      uVar45 = 0;
      auVar67 = auVar74;
      do {
        auVar88._10_2_ = (short)(local_168 + (int)(uVar50 * iVar26))[ptr[uVar45 + 5]];
        auVar88._8_2_ = (short)(local_168 + (int)(uVar37 * iVar26))[ptr[uVar45 + 4]];
        auVar88._12_2_ = (short)(local_168 + (int)(uVar21 * iVar26))[ptr[uVar45 + 6]];
        auVar88._14_2_ = (short)(local_168 + (int)(uVar49 * iVar26))[ptr[uVar45 + 7]];
        auVar88._0_8_ =
             (ulong)(uint)(local_168 + (int)(uVar29 * iVar26))[ptr[uVar45]] & 0xffffffff0000ffff |
             (ulong)*(ushort *)(local_168 + (int)(uVar40 * iVar26) + ptr[uVar45 + 1]) << 0x10 |
             (ulong)*(ushort *)(local_168 + (int)(uVar44 * iVar26) + ptr[uVar45 + 2]) << 0x20 |
             (ulong)*(ushort *)(local_168 + (int)(uVar33 * iVar26) + ptr[uVar45 + 3]) << 0x30;
        auVar56 = paddsw(auVar88,auVar71);
        auVar71._0_8_ = auVar90._2_8_;
        auVar71._8_8_ = auVar90._8_8_ >> 0x10 | (ulong)(ushort)ptr_00[uVar45 + 7] << 0x30;
        auVar87._0_8_ = auVar67._2_8_;
        auVar87._8_8_ = auVar67._8_8_ >> 0x10 | (ulong)(ushort)ptr_01[uVar45 + 7] << 0x30;
        auVar18._4_4_ = uStack_74;
        auVar18._0_4_ = local_78;
        auVar18._8_4_ = uStack_70;
        auVar18._12_4_ = uStack_6c;
        auVar67 = psubsw(auVar71,auVar18);
        auVar17._4_4_ = uStack_84;
        auVar17._0_4_ = local_88;
        auVar17._8_4_ = uStack_80;
        auVar17._12_4_ = uStack_7c;
        auVar88 = psubsw(auVar87,auVar17);
        sVar32 = auVar67._0_2_;
        sVar84 = auVar88._0_2_;
        auVar89._0_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._2_2_;
        sVar84 = auVar88._2_2_;
        auVar89._2_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._4_2_;
        sVar84 = auVar88._4_2_;
        auVar89._4_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._6_2_;
        sVar84 = auVar88._6_2_;
        auVar89._6_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._8_2_;
        sVar84 = auVar88._8_2_;
        auVar89._8_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._10_2_;
        sVar84 = auVar88._10_2_;
        auVar89._10_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._12_2_;
        sVar84 = auVar88._12_2_;
        sVar86 = auVar88._14_2_;
        auVar89._12_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar67._14_2_;
        auVar89._14_2_ = (ushort)(sVar86 < sVar32) * sVar32 | (ushort)(sVar86 >= sVar32) * sVar86;
        auVar90 = psubsw(auVar90,auVar18);
        auVar67 = psubsw(auVar74,auVar17);
        sVar32 = auVar90._0_2_;
        sVar84 = auVar67._0_2_;
        auVar85._0_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._2_2_;
        sVar84 = auVar67._2_2_;
        auVar85._2_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._4_2_;
        sVar84 = auVar67._4_2_;
        auVar85._4_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._6_2_;
        sVar84 = auVar67._6_2_;
        auVar85._6_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._8_2_;
        sVar84 = auVar67._8_2_;
        auVar85._8_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._10_2_;
        sVar84 = auVar67._10_2_;
        auVar85._10_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._12_2_;
        sVar84 = auVar67._12_2_;
        sVar86 = auVar67._14_2_;
        auVar85._12_2_ = (ushort)(sVar84 < sVar32) * sVar32 | (ushort)(sVar84 >= sVar32) * sVar84;
        sVar32 = auVar90._14_2_;
        auVar85._14_2_ = (ushort)(sVar86 < sVar32) * sVar32 | (ushort)(sVar86 >= sVar32) * sVar86;
        uVar73 = ((short)auVar85._0_2_ < (short)auVar89._0_2_) * auVar89._0_2_ |
                 ((short)auVar85._0_2_ >= (short)auVar89._0_2_) * auVar85._0_2_;
        uVar77 = ((short)auVar85._2_2_ < (short)auVar89._2_2_) * auVar89._2_2_ |
                 ((short)auVar85._2_2_ >= (short)auVar89._2_2_) * auVar85._2_2_;
        uVar78 = ((short)auVar85._4_2_ < (short)auVar89._4_2_) * auVar89._4_2_ |
                 ((short)auVar85._4_2_ >= (short)auVar89._4_2_) * auVar85._4_2_;
        uVar79 = ((short)auVar85._6_2_ < (short)auVar89._6_2_) * auVar89._6_2_ |
                 ((short)auVar85._6_2_ >= (short)auVar89._6_2_) * auVar85._6_2_;
        uVar80 = ((short)auVar85._8_2_ < (short)auVar89._8_2_) * auVar89._8_2_ |
                 ((short)auVar85._8_2_ >= (short)auVar89._8_2_) * auVar85._8_2_;
        uVar81 = ((short)auVar85._10_2_ < (short)auVar89._10_2_) * auVar89._10_2_ |
                 ((short)auVar85._10_2_ >= (short)auVar89._10_2_) * auVar85._10_2_;
        uVar82 = ((short)auVar85._12_2_ < (short)auVar89._12_2_) * auVar89._12_2_ |
                 ((short)auVar85._12_2_ >= (short)auVar89._12_2_) * auVar85._12_2_;
        uVar83 = ((short)auVar85._14_2_ < (short)auVar89._14_2_) * auVar89._14_2_ |
                 ((short)auVar85._14_2_ >= (short)auVar89._14_2_) * auVar85._14_2_;
        sVar32 = auVar56._0_2_;
        auVar75._0_2_ =
             (ushort)((short)uVar73 < sVar32) * sVar32 | ((short)uVar73 >= sVar32) * uVar73;
        sVar32 = auVar56._2_2_;
        auVar75._2_2_ =
             (ushort)((short)uVar77 < sVar32) * sVar32 | ((short)uVar77 >= sVar32) * uVar77;
        sVar32 = auVar56._4_2_;
        auVar75._4_2_ =
             (ushort)((short)uVar78 < sVar32) * sVar32 | ((short)uVar78 >= sVar32) * uVar78;
        sVar32 = auVar56._6_2_;
        auVar75._6_2_ =
             (ushort)((short)uVar79 < sVar32) * sVar32 | ((short)uVar79 >= sVar32) * uVar79;
        sVar32 = auVar56._8_2_;
        auVar75._8_2_ =
             (ushort)((short)uVar80 < sVar32) * sVar32 | ((short)uVar80 >= sVar32) * uVar80;
        sVar32 = auVar56._10_2_;
        auVar75._10_2_ =
             (ushort)((short)uVar81 < sVar32) * sVar32 | ((short)uVar81 >= sVar32) * uVar81;
        sVar32 = auVar56._12_2_;
        auVar75._12_2_ =
             (ushort)((short)uVar82 < sVar32) * sVar32 | ((short)uVar82 >= sVar32) * uVar82;
        sVar32 = auVar56._14_2_;
        auVar75._14_2_ =
             (ushort)((short)uVar83 < sVar32) * sVar32 | ((short)uVar83 >= sVar32) * uVar83;
        sVar51 = in_XMM15._0_2_;
        auVar57._0_2_ = -(ushort)(sVar51 == -1);
        sVar59 = in_XMM15._2_2_;
        auVar57._2_2_ = -(ushort)(sVar59 == -1);
        sVar60 = in_XMM15._4_2_;
        auVar57._4_2_ = -(ushort)(sVar60 == -1);
        sVar61 = in_XMM15._6_2_;
        auVar57._6_2_ = -(ushort)(sVar61 == -1);
        sVar62 = in_XMM15._8_2_;
        auVar57._8_2_ = -(ushort)(sVar62 == -1);
        sVar63 = in_XMM15._10_2_;
        auVar57._10_2_ = -(ushort)(sVar63 == -1);
        sVar64 = in_XMM15._12_2_;
        sVar65 = in_XMM15._14_2_;
        auVar57._12_2_ = -(ushort)(sVar64 == -1);
        auVar57._14_2_ = -(ushort)(sVar65 == -1);
        auVar90 = pblendvb(auVar75,local_1d8,auVar57);
        auVar56._4_2_ = local_1e8;
        auVar56._0_4_ = uVar52;
        auVar56._6_2_ = sStack_1e6;
        auVar56._8_2_ = local_1e8;
        auVar56._10_2_ = sStack_1e6;
        auVar56._12_2_ = local_1e8;
        auVar56._14_2_ = sStack_1e6;
        auVar67 = pblendvb(auVar89,auVar56,auVar57);
        auVar74 = pblendvb(auVar85,auVar56,auVar57);
        sVar32 = auVar90._0_2_;
        sVar84 = auVar90._2_2_;
        sVar14 = auVar90._14_2_;
        sVar8 = auVar90._8_2_;
        sVar10 = auVar90._10_2_;
        sVar12 = auVar90._12_2_;
        sVar86 = auVar90._4_2_;
        sVar7 = auVar90._6_2_;
        if (7 < uVar45) {
          bVar4 = sVar32 < (short)local_1b8;
          uVar73 = (ushort)!bVar4 * (short)local_1b8;
          bVar5 = sVar84 < local_1b8._2_2_;
          uVar77 = (ushort)!bVar5 * local_1b8._2_2_;
          bVar6 = sVar86 < local_1b8._4_2_;
          uVar78 = (ushort)!bVar6 * local_1b8._4_2_;
          bVar9 = sVar8 < (short)uStack_1b0;
          uVar79 = (ushort)!bVar9 * (short)uStack_1b0;
          bVar11 = sVar10 < uStack_1b0._2_2_;
          uVar80 = (ushort)!bVar11 * uStack_1b0._2_2_;
          bVar13 = sVar12 < uStack_1b0._4_2_;
          uVar81 = (ushort)!bVar13 * uStack_1b0._4_2_;
          local_1b8 = CONCAT26((ushort)(sVar7 < local_1b8._6_2_) * sVar7 |
                               (ushort)(sVar7 >= local_1b8._6_2_) * local_1b8._6_2_,
                               CONCAT24((ushort)bVar6 * sVar86 | uVar78,
                                        CONCAT22((ushort)bVar5 * sVar84 | uVar77,
                                                 (ushort)bVar4 * sVar32 | uVar73)));
          uStack_1b0 = CONCAT26((ushort)(sVar14 < uStack_1b0._6_2_) * sVar14 |
                                (ushort)(sVar14 >= uStack_1b0._6_2_) * uStack_1b0._6_2_,
                                CONCAT24((ushort)bVar13 * sVar12 | uVar81,
                                         CONCAT22((ushort)bVar11 * sVar10 | uVar80,
                                                  (ushort)bVar9 * sVar8 | uVar79)));
          local_1a8._2_2_ =
               (ushort)((short)local_1a8._2_2_ < sVar84) * sVar84 |
               (ushort)((short)local_1a8._2_2_ >= sVar84) * local_1a8._2_2_;
          local_1a8._0_2_ =
               (ushort)((short)local_1a8._0_2_ < sVar32) * sVar32 |
               (ushort)((short)local_1a8._0_2_ >= sVar32) * local_1a8._0_2_;
          local_1a8._4_2_ =
               (ushort)((short)local_1a8._4_2_ < sVar86) * sVar86 |
               (ushort)((short)local_1a8._4_2_ >= sVar86) * local_1a8._4_2_;
          local_1a8._6_2_ =
               (ushort)((short)local_1a8._6_2_ < sVar7) * sVar7 |
               (ushort)((short)local_1a8._6_2_ >= sVar7) * local_1a8._6_2_;
          local_1a8._8_2_ =
               (ushort)((short)local_1a8._8_2_ < sVar8) * sVar8 |
               (ushort)((short)local_1a8._8_2_ >= sVar8) * local_1a8._8_2_;
          local_1a8._10_2_ =
               (ushort)((short)local_1a8._10_2_ < sVar10) * sVar10 |
               (ushort)((short)local_1a8._10_2_ >= sVar10) * local_1a8._10_2_;
          local_1a8._12_2_ =
               (ushort)((short)local_1a8._12_2_ < sVar12) * sVar12 |
               (ushort)((short)local_1a8._12_2_ >= sVar12) * local_1a8._12_2_;
          local_1a8._14_2_ =
               (ushort)((short)local_1a8._14_2_ < sVar14) * sVar14 |
               (ushort)((short)local_1a8._14_2_ >= sVar14) * local_1a8._14_2_;
        }
        piVar2 = ((ppVar22->field_4).rowcols)->score_row;
        piVar3 = ((ppVar22->field_4).rowcols)->score_col;
        if (local_220 == uVar28 && uVar45 < uVar46) {
          piVar2[uVar45] = (int)sVar14;
        }
        if (s2Len - 1 == uVar45) {
          piVar3[local_220] = (int)sVar14;
        }
        if (uVar45 - 1 < uVar46 && uVar24 == uVar28) {
          piVar2[uVar45 - 1] = (int)sVar12;
        }
        if (uVar46 == uVar45 && uVar24 < uVar35) {
          piVar3[uVar24] = (int)sVar12;
        }
        if ((uVar25 == uVar28) && ((long)(uVar45 - 2) < (long)uVar46 && 1 < uVar45)) {
          piVar2[uVar45 - 2] = (int)sVar10;
        }
        if (uVar46 + 1 == uVar45 && uVar25 < uVar35) {
          piVar3[uVar25] = (int)sVar10;
        }
        if ((uVar47 == uVar28) && ((long)(uVar45 - 3) < (long)uVar46 && 2 < uVar45)) {
          piVar2[uVar45 - 3] = (int)sVar8;
        }
        if (uVar46 + 2 == uVar45 && uVar47 < uVar35) {
          piVar3[uVar47] = (int)sVar8;
        }
        if ((uVar31 == uVar28) && ((long)(uVar45 - 4) < (long)uVar46 && 3 < uVar45)) {
          piVar2[uVar45 - 4] = (int)sVar7;
        }
        if (uVar46 + 3 == uVar45 && uVar31 < uVar35) {
          piVar3[uVar31] = (int)sVar7;
        }
        if ((uVar34 == uVar28) && ((long)(uVar45 - 5) < (long)uVar46 && 4 < uVar45)) {
          piVar2[uVar45 - 5] = (int)sVar86;
        }
        if (uVar46 + 4 == uVar45 && uVar34 < uVar35) {
          piVar3[uVar34] = (int)sVar86;
        }
        if ((uVar38 == uVar28) && ((long)(uVar45 - 6) < (long)uVar46 && 5 < uVar45)) {
          piVar2[uVar45 - 6] = (int)sVar84;
        }
        if (uVar46 + 5 == uVar45 && uVar38 < uVar35) {
          piVar3[uVar38] = (int)sVar84;
        }
        if (6 < uVar45 && uVar42 == uVar28) {
          piVar2[uVar45 - 7] = (int)sVar32;
        }
        if (uVar46 + 6 == uVar45 && uVar42 < uVar35) {
          piVar3[uVar42] = (int)sVar32;
        }
        auVar68._0_2_ = -(ushort)(auVar66._0_2_ < (short)local_48._0_2_);
        auVar68._2_2_ = -(ushort)(auVar66._2_2_ < (short)local_48._2_2_);
        auVar68._4_2_ = -(ushort)(auVar66._4_2_ < (short)local_48._4_2_);
        auVar68._6_2_ = -(ushort)(auVar66._6_2_ < (short)local_48._6_2_);
        auVar68._8_2_ = -(ushort)(auVar66._8_2_ < (short)local_48._8_2_);
        auVar68._10_2_ = -(ushort)(auVar66._10_2_ < (short)local_48._10_2_);
        auVar68._12_2_ = -(ushort)(auVar66._12_2_ < (short)local_48._12_2_);
        auVar68._14_2_ = -(ushort)(auVar66._14_2_ < (short)local_48._14_2_);
        auVar58._0_2_ = -(ushort)(sVar51 < (short)local_68._0_2_);
        auVar58._2_2_ = -(ushort)(sVar59 < (short)local_68._2_2_);
        auVar58._4_2_ = -(ushort)(sVar60 < (short)local_68._4_2_);
        auVar58._6_2_ = -(ushort)(sVar61 < (short)local_68._6_2_);
        auVar58._8_2_ = -(ushort)(sVar62 < (short)local_68._8_2_);
        auVar58._10_2_ = -(ushort)(sVar63 < (short)local_68._10_2_);
        auVar58._12_2_ = -(ushort)(sVar64 < (short)local_68._12_2_);
        auVar58._14_2_ = -(ushort)(sVar65 < (short)local_68._14_2_);
        auVar56 = psraw(in_XMM15,0xf);
        auVar72._0_2_ = -(ushort)(local_178._0_2_ < sVar32);
        auVar72._2_2_ = -(ushort)(local_178._2_2_ < sVar84);
        auVar72._4_2_ = -(ushort)(local_178._4_2_ < sVar86);
        auVar72._6_2_ = -(ushort)(local_178._6_2_ < sVar7);
        auVar72._8_2_ = -(ushort)(local_178._8_2_ < sVar8);
        auVar72._10_2_ = -(ushort)(local_178._10_2_ < sVar10);
        auVar72._12_2_ = -(ushort)(local_178._12_2_ < sVar12);
        auVar72._14_2_ = -(ushort)(local_178._14_2_ < sVar14);
        auVar72 = ~auVar56 & auVar58 & auVar91 & auVar72;
        local_178 = pblendvb(local_178,auVar75,auVar72);
        auVar76._0_2_ = -(ushort)(local_58._0_2_ == sVar51);
        auVar76._2_2_ = -(ushort)(local_58._2_2_ == sVar59);
        auVar76._4_2_ = -(ushort)(local_58._4_2_ == sVar60);
        auVar76._6_2_ = -(ushort)(local_58._6_2_ == sVar61);
        auVar76._8_2_ = -(ushort)(local_58._8_2_ == sVar62);
        auVar76._10_2_ = -(ushort)(local_58._10_2_ == sVar63);
        auVar76._12_2_ = -(ushort)(local_58._12_2_ == sVar64);
        auVar76._14_2_ = -(ushort)(local_58._14_2_ == sVar65);
        auVar69._0_2_ = -(ushort)(local_188._0_2_ < sVar32);
        auVar69._2_2_ = -(ushort)(local_188._2_2_ < sVar84);
        auVar69._4_2_ = -(ushort)(local_188._4_2_ < sVar86);
        auVar69._6_2_ = -(ushort)(local_188._6_2_ < sVar7);
        auVar69._8_2_ = -(ushort)(local_188._8_2_ < sVar8);
        auVar69._10_2_ = -(ushort)(local_188._10_2_ < sVar10);
        auVar69._12_2_ = -(ushort)(local_188._12_2_ < sVar12);
        auVar69._14_2_ = -(ushort)(local_188._14_2_ < sVar14);
        auVar69 = auVar68 & auVar76 & auVar69;
        local_188 = pblendvb(local_188,auVar90,auVar69);
        local_b8 = pblendvb(local_b8,auVar90,auVar76 & auVar91);
        local_198 = pblendvb(local_198,auVar66,auVar69);
        local_c8 = pblendvb(local_c8,in_XMM15,auVar72);
        ptr_00[uVar45] = sVar32;
        ptr_01[uVar45] = auVar67._0_2_;
        in_XMM15 = paddsw(in_XMM15,_DAT_00904d10);
        uVar45 = uVar45 + 1;
      } while (local_128 != uVar45);
      auVar66 = paddsw(auVar66,_DAT_00904d20);
      auVar16._4_4_ = uStack_d4;
      auVar16._0_4_ = local_d8;
      auVar16._8_4_ = uStack_d0;
      auVar16._12_4_ = uStack_cc;
      local_1d8 = psubsw(local_1d8,auVar16);
      local_220 = local_160;
    } while (local_160 < uVar35);
    local_a8 = auVar55;
  }
  lVar23 = 0;
  iVar30 = 0;
  iVar20 = 0;
  iVar26 = 0;
  uVar48 = uVar36;
  uVar27 = uVar36;
  do {
    uVar1 = *(ushort *)(local_188 + lVar23 * 2);
    if ((short)(ushort)uVar48 < (short)uVar1) {
      iVar39 = (int)*(short *)(local_198 + lVar23 * 2);
      iVar30 = (int)*(short *)(local_198 + lVar23 * 2);
      uVar48 = (uint)uVar1;
    }
    else {
      iVar39 = iVar26;
      if (uVar1 == (ushort)uVar48) {
        iVar41 = (int)*(short *)(local_198 + lVar23 * 2);
        iVar39 = iVar30;
        if (iVar41 <= iVar26) {
          iVar39 = iVar41;
        }
        iVar30 = iVar39;
        if (iVar41 < iVar26) {
          uVar48 = (uint)uVar1;
        }
      }
    }
    sVar19 = (short)uVar48;
    if ((short)uVar27 < (short)*(ushort *)(local_178 + lVar23 * 2)) {
      iVar20 = (int)*(short *)(local_c8 + lVar23 * 2);
      uVar27 = (uint)*(ushort *)(local_178 + lVar23 * 2);
    }
    sVar32 = (short)uVar27;
    uVar49 = (uint)*(ushort *)(local_b8 + lVar23 * 2);
    if ((short)*(ushort *)(local_b8 + lVar23 * 2) <= (short)uVar36) {
      uVar49 = uVar36;
    }
    uVar36 = uVar49;
    lVar23 = lVar23 + 1;
    iVar26 = iVar39;
  } while ((int)lVar23 != 8);
  sVar84 = sVar32;
  iVar26 = iVar20;
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end != 0) goto LAB_00709725;
    sVar84 = (short)uVar36;
    iVar26 = s2Len + -1;
    if (s2_end != 0) {
      sVar84 = sVar32;
      iVar26 = iVar20;
    }
  }
  else {
    if (sVar32 < sVar19) {
LAB_00709725:
      iVar30 = s2Len + -1;
      goto LAB_00709784;
    }
    if ((sVar19 == sVar32) && (iVar30 = s2Len + -1, iVar20 == s2Len + -1)) goto LAB_00709784;
  }
  sVar19 = sVar84;
  iVar39 = _s1Len - 1;
  iVar30 = iVar26;
LAB_00709784:
  auVar55._0_2_ = -(ushort)((short)local_1b8 < local_1e8);
  auVar55._2_2_ = -(ushort)(local_1b8._2_2_ < sStack_1e6);
  auVar55._4_2_ = -(ushort)(local_1b8._4_2_ < local_1e8);
  auVar55._6_2_ = -(ushort)(local_1b8._6_2_ < sStack_1e6);
  auVar55._8_2_ = -(ushort)((short)uStack_1b0 < local_1e8);
  auVar55._10_2_ = -(ushort)(uStack_1b0._2_2_ < sStack_1e6);
  auVar55._12_2_ = -(ushort)(uStack_1b0._4_2_ < local_1e8);
  auVar55._14_2_ = -(ushort)(uStack_1b0._6_2_ < sStack_1e6);
  auVar70._0_2_ = -(ushort)(local_1c8 < local_1a8._0_2_);
  auVar70._2_2_ = -(ushort)(sStack_1c6 < local_1a8._2_2_);
  auVar70._4_2_ = -(ushort)(local_1c8 < local_1a8._4_2_);
  auVar70._6_2_ = -(ushort)(sStack_1c6 < local_1a8._6_2_);
  auVar70._8_2_ = -(ushort)(local_1c8 < local_1a8._8_2_);
  auVar70._10_2_ = -(ushort)(sStack_1c6 < local_1a8._10_2_);
  auVar70._12_2_ = -(ushort)(local_1c8 < local_1a8._12_2_);
  auVar70._14_2_ = -(ushort)(sStack_1c6 < local_1a8._14_2_);
  auVar70 = auVar70 | auVar55;
  if ((((((((((((((((auVar70 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar70 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar70 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar70 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar70 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar70 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar70 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar70 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar70 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar70 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar70 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar70 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar70 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar70 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar70 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar70[0xf] < '\0') {
    *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
    sVar19 = 0;
    iVar30 = 0;
    iVar39 = 0;
  }
  ppVar22->score = (int)sVar19;
  ppVar22->end_query = iVar39;
  ppVar22->end_ref = iVar30;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar22;
  }
  return ppVar22;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi16(NEG_LIMIT);
    vOpen = _mm_set1_epi16(open);
    vGap  = _mm_set1_epi16(gap);
    vOne = _mm_set1_epi16(1);
    vN = _mm_set1_epi16(N);
    vGapN = s1_beg ? _mm_set1_epi16(0) : _mm_set1_epi16(gap*N);
    vNegOne = _mm_set1_epi16(-1);
    vI = _mm_set_epi16(0,1,2,3,4,5,6,7);
    vJreset = _mm_set_epi16(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi16(s1Len);
    vILimit1 = _mm_subs_epi16(vILimit, vOne);
    vJLimit = _mm_set1_epi16(s2Len);
    vJLimit1 = _mm_subs_epi16(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi16(0) : _mm_set_epi16(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap,
            -open-4*gap,
            -open-5*gap,
            -open-6*gap,
            -open-7*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m128i vIltLimit = _mm_cmplt_epi16(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi16(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 2);
        vNH = _mm_insert_epi16(vNH, H_pr[-1], 7);
        vWH = _mm_srli_si128(vWH, 2);
        vWH = _mm_insert_epi16(vWH, s1_beg ? 0 : (-open - i*gap), 7);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 2);
            vNH = _mm_insert_epi16(vNH, H_pr[j], 7);
            vF = _mm_srli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, F_pr[j], 7);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vNH, vOpen),
                    _mm_subs_epi16(vF, vGap));
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vWH, vOpen),
                    _mm_subs_epi16(vE, vGap));
            vMat = _mm_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm_adds_epi16(vNWH, vMat);
            vWH = _mm_max_epi16(vNWH, vE);
            vWH = _mm_max_epi16(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm_blendv_epi8(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8(vF, vNegInf, cond);
                vE = _mm_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int16_t)_mm_extract_epi16(vWH,0);
            F_pr[j-7] = (int16_t)_mm_extract_epi16(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi16(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi16(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi16(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi16(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi16(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_adds_epi16(vJ, vOne);
        }
        vI = _mm_adds_epi16(vI, vN);
        vIBoundary = _mm_subs_epi16(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int16_t max_row = NEG_LIMIT;
        int16_t max_col = NEG_LIMIT;
        int16_t last_val = NEG_LIMIT;
        int16_t *s = (int16_t*)&vMaxHRow;
        int16_t *t = (int16_t*)&vMaxHCol;
        int16_t *u = (int16_t*)&vLastVal;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}